

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fits_translate_keyword
              (char *inrec,char *outrec,char *(*patterns) [2],int npat,int n_value,int n_offset,
              int n_range,int *pat_num,int *i,int *j,int *m,int *n,int *status)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ushort **ppuVar5;
  bool bVar6;
  bool bVar7;
  int local_6c;
  int val;
  char *spat;
  int firstfail;
  int pass;
  int pat;
  int ic;
  int ip;
  char s;
  char c;
  char oldp;
  char a;
  int fac;
  int m1;
  int n1;
  int j1;
  int i1;
  int n_offset_local;
  int n_value_local;
  int npat_local;
  char *(*patterns_local) [2];
  char *outrec_local;
  char *inrec_local;
  
  n1 = 0;
  m1 = 0;
  fac = 0;
  _s = 0;
  ic._3_1_ = ' ';
  bVar7 = false;
  if (*status < 1) {
    if ((inrec == (char *)0x0) || (outrec == (char *)0x0)) {
      *status = 0x73;
      inrec_local._4_4_ = 0x73;
    }
    else {
      *outrec = '\0';
      if (*inrec == '\0') {
        strcpy(inrec,"        ");
      }
      ic._2_1_ = '\0';
      bVar3 = false;
      for (firstfail = 0; firstfail < npat; firstfail = firstfail + 1) {
        pcVar2 = patterns[firstfail][0];
        n1 = 0;
        m1 = 0;
        _s = -1;
        fac = -1;
        ic._3_1_ = ' ';
        bVar7 = false;
        if (*pcVar2 == '*') {
          bVar7 = true;
          break;
        }
        if ((!bVar3) || (*pcVar2 != ic._2_1_)) {
          ic._2_1_ = *pcVar2;
          pat = 0;
          bVar3 = true;
          for (pass = 0; pcVar2[pat] != '\0' && pass < 8; pass = pass + 1) {
            ic._1_1_ = inrec[pass];
            cVar1 = pcVar2[pat];
            if (cVar1 == 'i') {
              ppuVar5 = __ctype_b_loc();
              if (((*ppuVar5)[(int)ic._1_1_] & 0x800) != 0) {
                n1 = ic._1_1_ + -0x30;
                bVar7 = true;
              }
            }
            else if (cVar1 == 'j') {
              ppuVar5 = __ctype_b_loc();
              if (((*ppuVar5)[(int)ic._1_1_] & 0x800) != 0) {
                m1 = ic._1_1_ + -0x30;
                bVar7 = true;
              }
            }
            else if (((cVar1 == 'n') || (cVar1 == 'm')) || (cVar1 == '#')) {
              local_6c = 0;
              bVar7 = false;
              ppuVar5 = __ctype_b_loc();
              if (((*ppuVar5)[(int)ic._1_1_] & 0x800) != 0) {
                bVar7 = true;
                while( true ) {
                  bVar6 = false;
                  if (pass < 8) {
                    ppuVar5 = __ctype_b_loc();
                    bVar6 = ((*ppuVar5)[(int)ic._1_1_] & 0x800) != 0;
                  }
                  if (!bVar6) break;
                  local_6c = local_6c * 10 + ic._1_1_ + -0x30;
                  pass = pass + 1;
                  ic._1_1_ = inrec[pass];
                }
                pass = pass + -1;
                if (cVar1 == 'n') {
                  if (((local_6c < 1) || (999 < local_6c)) ||
                     ((((n_range != 0 || (local_6c != n_value)) &&
                       ((n_range != -1 || (n_value < local_6c)))) &&
                      ((n_range != 1 || (local_6c < n_value)))))) {
                    bVar7 = false;
                  }
                  else {
                    fac = local_6c;
                  }
                }
                else if (cVar1 == 'm') {
                  _s = local_6c;
                }
              }
            }
            else if (cVar1 == 'a') {
              ppuVar5 = __ctype_b_loc();
              if ((((*ppuVar5)[(int)ic._1_1_] & 0x100) != 0) || (ic._1_1_ == ' ')) {
                bVar7 = true;
                ic._3_1_ = ic._1_1_;
              }
            }
            else if (cVar1 == '?') {
              bVar7 = true;
            }
            else {
              bVar7 = ic._1_1_ == cVar1;
            }
            if (!bVar7) break;
            pat = pat + 1;
            bVar3 = false;
          }
          if ((bVar7) && ((7 < pass || (inrec[pass] == ' ')))) break;
        }
      }
      if (i != (int *)0x0) {
        *i = n1;
      }
      if (j != (int *)0x0) {
        *j = m1;
      }
      if (n != (int *)0x0) {
        *n = fac;
      }
      if (m != (int *)0x0) {
        *m = _s;
      }
      if (pat_num != (int *)0x0) {
        *pat_num = firstfail;
      }
      pcVar2 = patterns[firstfail][1];
      if ((bVar7) && (iVar4 = strcmp(pcVar2,"--"), iVar4 == 0)) {
        strcpy(outrec,"-");
        strncat(outrec,inrec,8);
        outrec[9] = '\0';
        n1 = 8;
        while( true ) {
          bVar7 = false;
          if (1 < n1) {
            bVar7 = outrec[n1] == ' ';
          }
          if (!bVar7) break;
          outrec[n1] = '\0';
          n1 = n1 + -1;
        }
        inrec_local._4_4_ = 0;
      }
      else if ((bVar7) && ((*pcVar2 != '\0' && (iVar4 = strcmp(pcVar2,"-"), iVar4 != 0)))) {
        strcpy(outrec,inrec);
        if (*pcVar2 == '+') {
          inrec_local._4_4_ = 0;
        }
        else {
          pass = 0;
          for (pat = 0; pcVar2[pat] != '\0'; pat = pat + 1) {
            cVar1 = pcVar2[pat];
            if (cVar1 == 'i') {
              outrec[pass] = (char)n1 + '0';
            }
            else if (cVar1 == 'j') {
              outrec[pass] = (char)m1 + '0';
            }
            else if (cVar1 == 'n') {
              if (fac == -1) {
                fac = n_value;
              }
              if (0 < fac) {
                fac = n_offset + fac;
                for (ip = 1; 0 < fac / ip; ip = ip * 10) {
                }
                while (ip = ip / 10, 0 < ip) {
                  outrec[pass] = (char)((long)((ulong)(uint)((int)((long)fac / (long)ip) >> 0x1f) <<
                                               0x20 | (long)fac / (long)ip & 0xffffffffU) % 10) +
                                 '0';
                  pass = pass + 1;
                }
                pass = pass + -1;
              }
            }
            else if ((cVar1 == 'm') && (-1 < _s)) {
              for (ip = 1; 0 < _s / ip; ip = ip * 10) {
              }
              while (ip = ip / 10, 0 < ip) {
                outrec[pass] = (char)((long)((ulong)(uint)((int)((long)_s / (long)ip) >> 0x1f) <<
                                             0x20 | (long)_s / (long)ip & 0xffffffffU) % 10) + '0';
                pass = pass + 1;
              }
              pass = pass + -1;
            }
            else if (cVar1 == 'a') {
              outrec[pass] = ic._3_1_;
            }
            else {
              outrec[pass] = cVar1;
            }
            pass = pass + 1;
          }
          for (; pass < 8; pass = pass + 1) {
            outrec[pass] = ' ';
          }
          inrec_local._4_4_ = *status;
        }
      }
      else {
        inrec_local._4_4_ = 0;
      }
    }
  }
  else {
    inrec_local._4_4_ = *status;
  }
  return inrec_local._4_4_;
}

Assistant:

int fits_translate_keyword(
      char *inrec,        /* I - input string */
      char *outrec,       /* O - output converted string, or */
                          /*     a null string if input does not  */
                          /*     match any of the patterns */
      char *patterns[][2],/* I - pointer to input / output string */
                          /*     templates */
      int npat,           /* I - number of templates passed */
      int n_value,        /* I - base 'n' template value of interest */
      int n_offset,       /* I - offset to be applied to the 'n' */
                          /*     value in the output string */
      int n_range,        /* I - controls range of 'n' template */
                          /*     values of interest (-1,0, or +1) */
      int *pat_num,       /* O - matched pattern number (0 based) or -1 */
      int *i,             /* O - value of i, if any, else 0 */
      int *j,             /* O - value of j, if any, else 0 */
      int *m,             /* O - value of m, if any, else 0 */
      int *n,             /* O - value of n, if any, else 0 */

      int *status)        /* IO - error status */

/* 

Translate a keyword name to a new name, based on a set of patterns.
The user passes an array of patterns to be matched.  Input pattern
number i is pattern[i][0], and output pattern number i is
pattern[i][1].  Keywords are matched against the input patterns.  If a
match is found then the keyword is re-written according to the output
pattern.

Order is important.  The first match is accepted.  The fastest match
will be made when templates with the same first character are grouped
together.

Several characters have special meanings:

     i,j - single digits, preserved in output template
     n - column number of one or more digits, preserved in output template
     m - generic number of one or more digits, preserved in output template
     a - coordinate designator, preserved in output template
     # - number of one or more digits
     ? - any character
     * - only allowed in first character position, to match all
         keywords; only useful as last pattern in the list

i, j, n, and m are returned by the routine.

For example, the input pattern "iCTYPn" will match "1CTYP5" (if n_value
is 5); the output pattern "CTYPEi" will be re-written as "CTYPE1".
Notice that "i" is preserved.

The following output patterns are special

Special output pattern characters:

    "-" - do not copy a keyword that matches the corresponding input pattern

    "+" - copy the input unchanged

The inrec string could be just the 8-char keyword name, or the entire 
80-char header record.  Characters 9 = 80 in the input string simply get
appended to the translated keyword name.

If n_range = 0, then only keywords with 'n' equal to n_value will be 
considered as a pattern match.  If n_range = +1, then all values of 
'n' greater than or equal to n_value will be a match, and if -1, 
then values of 'n' less than or equal to n_value will match.

  This routine was written by Craig Markwardt, GSFC
*/

{
    int i1 = 0, j1 = 0, n1 = 0, m1 = 0;
    int fac;
    char a = ' ';
    char oldp;
    char c, s;
    int ip, ic, pat, pass = 0, firstfail;
    char *spat;

    if (*status > 0)
        return(*status);
    if ((inrec == 0) || (outrec == 0)) 
      return (*status = NULL_INPUT_PTR);

    *outrec = '\0';
/*
    if (*inrec == '\0') return 0;
*/

    if (*inrec == '\0')    /* expand to full 8 char blank keyword name */
       strcpy(inrec, "        ");
       
    oldp = '\0';
    firstfail = 0;

    /* ===== Pattern match stage */
    for (pat=0; pat < npat; pat++) {
      spat = patterns[pat][0];
      
      i1 = 0; j1 = 0; m1 = -1; n1 = -1; a = ' ';  /* Initialize the place-holders */
      pass = 0;
      
      /* Pass the wildcard pattern */
      if (spat[0] == '*') { 
	pass = 1;
	break;
      }
      
      /* Optimization: if we have seen this initial pattern character before,
	 then it must have failed, and we can skip the pattern */
      if (firstfail && spat[0] == oldp) continue;
      oldp = spat[0];

      /* 
	 ip = index of pattern character being matched
	 ic = index of keyname character being matched
	 firstfail = 1 if we fail on the first characteor (0=not)
      */
      
      for (ip=0, ic=0, firstfail=1;
	   (spat[ip]) && (ic < 8);
	   ip++, ic++, firstfail=0) {
	c = inrec[ic];
	s = spat[ip];

	if (s == 'i') {
	  /* Special pattern: 'i' placeholder */
	  if (isdigit(c)) { i1 = c - '0'; pass = 1;}
	} else if (s == 'j') {
	  /* Special pattern: 'j' placeholder */
	  if (isdigit(c)) { j1 = c - '0'; pass = 1;}
	} else if ((s == 'n')||(s == 'm')||(s == '#')) {
	  /* Special patterns: multi-digit number */
	  int val = 0;
	  pass = 0;
	  if (isdigit(c)) {
	    pass = 1;  /* NOTE, could fail below */
	    
	    /* Parse decimal number */
	    while (ic<8 && isdigit(c)) { 
	      val = val*10 + (c - '0');
	      ic++; c = inrec[ic];
	    }
	    ic--; c = inrec[ic];
	    
	    if (s == 'n') { 
	      
	      /* Is it a column number? */
	      if ( val >= 1 && val <= 999 &&                    /* Row range check */
		   (((n_range == 0) && (val == n_value)) ||     /* Strict equality */
		    ((n_range == -1) && (val <= n_value)) ||    /* n <= n_value */
		    ((n_range == +1) && (val >= n_value))) ) {  /* n >= n_value */
		n1 = val;
	      } else {
		pass = 0;
	      }
	    } else if (s == 'm') {
	      
	      /* Generic number */
	      m1 = val; 
	    }
	  }
	} else if (s == 'a') {
	  /* Special pattern: coordinate designator */
	  if (isupper(c) || c == ' ') { a = c; pass = 1;} 
	} else if (s == '?') {
	  /* Match any individual character */
	  pass = 1;
	} else if (c == s) {
	  /* Match a specific character */
	  pass = 1;
	} else {
	  /* FAIL */
	  pass = 0;
	}
	if (!pass) break;
      }
      
      /* Must pass to the end of the keyword.  No partial matches allowed */
      if (pass && (ic >= 8 || inrec[ic] == ' ')) break;
    }

    /* Transfer the pattern-matched numbers to the output parameters */
    if (i) { *i = i1; }
    if (j) { *j = j1; }
    if (n) { *n = n1; }
    if (m) { *m = m1; }
    if (pat_num) { *pat_num = pat; }

    /* ===== Keyword rewriting and output stage */
    spat = patterns[pat][1];

    /* Return case: explicit deletion, return '-' */
    if (pass && strcmp(spat,"--") == 0) {
      strcpy(outrec, "-");
      strncat(outrec, inrec, 8);
      outrec[9] = 0;
      for(i1=8; i1>1 && outrec[i1] == ' '; i1--) outrec[i1] = 0;
      return 0;
    }

    /* Return case: no match, or do-not-transfer pattern */
    if (pass == 0 || spat[0] == '\0' || strcmp(spat,"-") == 0) return 0;
    /* A match: we start by copying the input record to the output */
    strcpy(outrec, inrec);

    /* Return case: return the input record unchanged */
    if (spat[0] == '+') return 0;


    /* Final case: a new output pattern */
    for (ip=0, ic=0; spat[ip]; ip++, ic++) {
      s = spat[ip];
      if (s == 'i') {
	outrec[ic] = (i1+'0');
      } else if (s == 'j') {
	outrec[ic] = (j1+'0');
      } else if (s == 'n') {
	if (n1 == -1) { n1 = n_value; }
	if (n1 > 0) {
	  n1 += n_offset;
	  for (fac = 1; (n1/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((n1/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
	}
      } else if (s == 'm' && m1 >= 0) {
	for (fac = 1; (m1/fac) > 0; fac *= 10);
	fac /= 10;
	while(fac > 0) {
	  outrec[ic] = ((m1/fac) % 10) + '0';
	  fac /= 10;
	  ic ++;
	}
	ic --;
      } else if (s == 'a') {
	outrec[ic] = a;
      } else {
	outrec[ic] = s;
      }
    }

    /* Pad the keyword name with spaces */
    for ( ; ic<8; ic++) { outrec[ic] = ' '; }

    return(*status);
}